

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bcatblk(bstring b,void *s,int len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = -1;
  if ((b != (bstring)0x0) && (b->data != (uchar *)0x0)) {
    uVar1 = b->slen;
    if (((-1 < (int)uVar1) &&
        (((iVar2 = b->mlen, (int)uVar1 <= iVar2 && (-1 < len)) && (s != (void *)0x0)))) &&
       (0 < iVar2)) {
      lVar4 = (ulong)uVar1 + (ulong)(uint)len;
      iVar3 = (int)lVar4;
      if ((iVar2 <= iVar3) && (iVar2 = balloc(b,iVar3 + 1), iVar2 < 0)) {
        return -1;
      }
      if (len != 0) {
        memmove(b->data + b->slen,s,(ulong)(uint)len);
      }
      b->slen = iVar3;
      b->data[lVar4] = '\0';
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int bcatblk (bstring b, const void * s, int len) {
int nl;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL || len < 0) return BSTR_ERR;

	if (0 > (nl = b->slen + len)) return BSTR_ERR; /* Overflow? */
	if (b->mlen <= nl && 0 > balloc (b, nl + 1)) return BSTR_ERR;

	bBlockCopy (&b->data[b->slen], s, (size_t) len);
	b->slen = nl;
	b->data[nl] = (unsigned char) '\0';
	return BSTR_OK;
}